

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dataset_metadata.cpp
# Opt level: O2

void __thiscall
dlib::image_dataset_metadata::doc_handler::end_element
          (doc_handler *this,unsigned_long param_1,string *name)

{
  bool bVar1;
  undefined1 local_b8 [32];
  pointer local_98;
  undefined8 uStack_90;
  pointer local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  size_t local_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined4 local_48;
  double local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined8 uStack_2c;
  double local_20;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&this->ts);
  if ((this->ts).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->ts).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar1 = std::operator==(name,"box");
    if ((bVar1) &&
       (bVar1 = std::operator==((this->ts).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1,"image"), bVar1)) {
      std::
      vector<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
      ::push_back(&(this->temp_image).boxes,&this->temp_box);
      local_80 = (_Base_ptr)&uStack_90;
      local_b8._0_8_ = (pointer)0x0;
      local_b8._8_8_ = 0;
      local_b8._16_4_ = 0xffffffff;
      local_b8._20_4_ = 0xffffffff;
      local_b8._24_4_ = 0xffffffff;
      local_b8._28_4_ = 0xffffffff;
      uStack_90 = (pointer)((ulong)uStack_90._4_4_ << 0x20);
      local_88 = (pointer)0x0;
      local_70 = 0;
      local_68._M_p = (pointer)&local_58;
      local_60 = 0;
      local_58._M_local_buf[0] = '\0';
      local_20 = 0.0;
      local_48._0_1_ = false;
      local_48._1_1_ = false;
      local_48._2_1_ = false;
      local_48._3_1_ = false;
      local_40 = 0.0;
      uStack_38 = 0;
      uStack_34 = 0;
      uStack_30 = 0;
      uStack_2c = 0;
      local_78 = local_80;
      box::operator=(&this->temp_box,(box *)local_b8);
      box::~box((box *)local_b8);
      return;
    }
    bVar1 = std::operator==(name,"image");
    if ((bVar1) &&
       (bVar1 = std::operator==((this->ts).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1,"images"), bVar1)) {
      std::
      vector<dlib::image_dataset_metadata::image,_std::allocator<dlib::image_dataset_metadata::image>_>
      ::push_back(&this->meta->images,&this->temp_image);
      local_b8._0_8_ = local_b8 + 0x10;
      local_b8._8_8_ = 0;
      local_b8._16_4_ = local_b8._16_4_ & 0xffffff00;
      local_98 = (pointer)0x0;
      uStack_90 = (pointer)0x0;
      local_88 = (pointer)0x0;
      image::operator=(&this->temp_image,(image *)local_b8);
      image::~image((image *)local_b8);
    }
  }
  return;
}

Assistant:

virtual void end_element ( 
                const unsigned long ,
                const std::string& name
            )
            {
                ts.pop_back();
                if (ts.size() == 0)
                    return;

                if (name == "box" && ts.back() == "image")
                {
                    temp_image.boxes.push_back(temp_box);
                    temp_box = box();
                }
                else if (name == "image" && ts.back() == "images")
                {
                    meta.images.push_back(temp_image);
                    temp_image = image();
                }
            }